

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O3

void __thiscall Clasp::Cli::TextOutput::printSummary(TextOutput *this,Summary *run,bool final)

{
  uint uVar1;
  FacadePtr pCVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char **ppcVar6;
  undefined4 extraout_var;
  char *pcVar7;
  char *pcVar8;
  SumVec *pSVar9;
  uint64 uVar10;
  Model *m;
  UPair UVar11;
  char *pcVar12;
  undefined7 in_register_00000011;
  TextOutput *pTVar13;
  Summary *this_00;
  char *pcVar14;
  SumVec local_58;
  undefined1 local_48 [24];
  
  if (((int)CONCAT71(in_register_00000011,final) != 0) && ((this->super_Output).quiet_[2] != '\x02')
     ) {
    comment(this,1,"%s\n",
            "====================================== Accumulation ======================================|"
           );
  }
  bVar3 = (run->result).flags & 3;
  if (bVar3 == 1) {
    bVar4 = ClaspFacade::Summary::optimum(run);
    ppcVar6 = this->result + (ulong)bVar4 * 2 + 1;
  }
  else if (bVar3 == 2) {
    ppcVar6 = this->result + 2;
  }
  else {
    ppcVar6 = this->result;
  }
  if (**ppcVar6 != '\0') {
    printf("%s%s\n",this->format[3]);
  }
  if (((this->super_Output).verbose_ == 0) &&
     (iVar5 = (*(run->facade->config_->super_BasicSatConfig).super_UserConfiguration.
                super_Configuration._vptr_Configuration[3])(),
     (*(byte *)(CONCAT44(extraout_var,iVar5) + 8) & 0x18) == 0)) {
    return;
  }
  puts(this->format[0]);
  bVar3 = (run->result).flags;
  if ((bVar3 & 8) != 0) {
    pcVar12 = "INTERRUPTED";
    if ((run->result).signal == '\x0e') {
      pcVar12 = "TIME LIMIT";
    }
    printf("%s%-*s: %u\n",this->format[0],(ulong)(uint)this->width_,pcVar12,1);
    bVar3 = (run->result).flags;
  }
  pcVar12 = "";
  if ((bVar3 & 4) == 0) {
    pcVar12 = "+";
  }
  printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Models");
  printf("%lu%s\n",run->numEnum,pcVar12);
  if (((run->result).flags & 3) == 1) {
    pcVar7 = ClaspFacade::Summary::consequences(run);
    if (pcVar7 != (char *)0x0) {
      pcVar7 = this->format[0];
      iVar5 = this->width_;
      pcVar8 = ClaspFacade::Summary::consequences(run);
      pcVar14 = "yes";
      if (((run->result).flags & 4) == 0) {
        pcVar14 = "unknown";
      }
      printf("%s  %-*s: %s\n",pcVar7,(ulong)(iVar5 - 2),pcVar8,pcVar14);
    }
    pSVar9 = ClaspFacade::Summary::costs(run);
    if (pSVar9 != (SumVec *)0x0) {
      pcVar7 = this->format[0];
      uVar1 = this->width_;
      bVar4 = ClaspFacade::Summary::optimum(run);
      pcVar8 = "unknown";
      if (bVar4) {
        pcVar8 = "yes";
      }
      printf("%s%-*s: %s\n",pcVar7,(ulong)uVar1,"  Optimum",pcVar8);
    }
    bVar4 = ClaspFacade::Summary::optimize(run);
    if (bVar4) {
      uVar10 = ClaspFacade::Summary::optimal(run);
      if (1 < uVar10) {
        pcVar7 = this->format[0];
        uVar1 = this->width_;
        uVar10 = ClaspFacade::Summary::optimal(run);
        printf("%s%-*s: %lu\n",pcVar7,(ulong)uVar1,"  Optimal",uVar10);
      }
      printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Optimization");
      pTVar13 = (TextOutput *)run;
      pSVar9 = ClaspFacade::Summary::costs(run);
      printCostsImpl(pTVar13,pSVar9,' ',"");
      putchar(10);
    }
    pcVar7 = ClaspFacade::Summary::consequences(run);
    if (pcVar7 != (char *)0x0) {
      printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Consequences");
      pCVar2 = run->facade;
      this_00 = run;
      m = ClaspFacade::Summary::model(run);
      UVar11 = Output::numCons((Output *)this_00,&(pCVar2->ctx).output,m);
      printf("%u%s\n",(ulong)UVar11 & 0xffffffff,pcVar12);
    }
  }
  bVar4 = ClaspFacade::Summary::hasLower(run);
  if ((bVar4) && (bVar4 = ClaspFacade::Summary::optimum(run), !bVar4)) {
    printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Bounds");
    ClaspFacade::Summary::lower((Summary *)&local_58);
    pTVar13 = (TextOutput *)run;
    pSVar9 = ClaspFacade::Summary::costs(run);
    if (pSVar9 == (SumVec *)0x0) {
      local_48._0_8_ = (_func_int **)0x0;
      local_48._8_8_ = 0.0;
    }
    else {
      pSVar9 = ClaspFacade::Summary::costs(run);
      pTVar13 = (TextOutput *)local_48;
      bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
                ((pod_vector<long,_std::allocator<long>_> *)pTVar13,pSVar9);
    }
    printBounds(pTVar13,&local_58,(SumVec *)local_48);
    if ((_func_int **)local_48._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_48._0_8_);
    }
    if ((FacadePtr)local_58.ebo_.buf != (FacadePtr)0x0) {
      operator_delete(local_58.ebo_.buf);
    }
    putchar(10);
  }
  if (final) {
    printf("%s%-*s: %u\n",this->format[0],(ulong)(uint)this->width_,"Calls",(ulong)(run->step + 1));
  }
  printf("%s%-*s: ",this->format[0],(ulong)(uint)this->width_,"Time");
  printf("%.3fs (Solving: %.2fs 1st Model: %.2fs Unsat: %.2fs)\n",SUB84(run->totalTime,0),
         run->solveTime,run->satTime,run->unsatTime);
  printf("%s%-*s: %.3fs\n",SUB84(run->cpuTime,0),this->format[0],(ulong)(uint)this->width_,
         "CPU Time");
  if (1 < ((uint)(run->facade->ctx).share_ & 0x3ff)) {
    printf("%s%-*s: %-8u",this->format[0],(ulong)(uint)this->width_,"Threads");
    printf(" (Winner: %u)\n",(ulong)((uint)(run->facade->ctx).share_ >> 10 & 0x3ff));
  }
  return;
}

Assistant:

void TextOutput::printSummary(const ClaspFacade::Summary& run, bool final) {
	if (final && callQ() != print_no){
		comment(1, "%s\n", finalSep);
	}
	const char* res = result[res_unknown];
	if      (run.unsat()) { res = result[res_unsat]; }
	else if (run.sat())   { res = !run.optimum() ? result[res_sat] : result[res_opt]; }
	if (*res) { printLN(cat_result, "%s", res); }
	if (verbosity() || stats(run)) {
		printBR(cat_comment);
		if (run.result.interrupted()){ printKeyValue((run.result.signal != SIGALRM ? "INTERRUPTED" : "TIME LIMIT"), "%u\n", uint32(1));  }
		const char* const moreStr = run.complete() ? "" :  "+";
		printKey("Models");
		printf("%" PRIu64 "%s\n", run.numEnum, moreStr);
		if (run.sat()) {
			if (run.consequences()) { printLN(cat_comment, "  %-*s: %s", width_-2, run.consequences(), (run.complete()?"yes":"unknown")); }
			if (run.costs())        { printKeyValue("  Optimum", "%s\n", run.optimum()?"yes":"unknown"); }
			if (run.optimize())     {
				if (run.optimal() > 1){ printKeyValue("  Optimal", "%" PRIu64"\n", run.optimal()); }
				printKey("Optimization");
				printCostsImpl(*run.costs(), ' ');
				printf("\n");
			}
			if (run.consequences()) {
				printKey("Consequences");
				printf("%u%s\n", numCons(run.ctx().output, *run.model()).first, moreStr);
			}
		}
		if (run.hasLower() && !run.optimum()) {
			printKey("Bounds");
			printBounds(run.lower(), run.costs() ? *run.costs() : SumVec());
			printf("\n");
		}
		if (final) { printKeyValue("Calls", "%u\n", run.step + 1); }
		printKey("Time");
		printf("%.3fs (Solving: %.2fs 1st Model: %.2fs Unsat: %.2fs)\n"
			, run.totalTime
			, run.solveTime
			, run.satTime
			, run.unsatTime);
		printKeyValue("CPU Time", "%.3fs\n", run.cpuTime);
		if (run.ctx().concurrency() > 1) {
			printKeyValue("Threads", "%-8u", run.ctx().concurrency());
			printf(" (Winner: %u)\n", run.ctx().winner());
		}
	}
}